

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O2

OPJ_INT32 opj_mqc_decode(opj_mqc_t *mqc)

{
  uint uVar1;
  opj_mqc_state_t *poVar2;
  OPJ_UINT32 OVar3;
  uint uVar4;
  ulong uVar5;
  
  poVar2 = *mqc->curctx;
  uVar1 = poVar2->qeval;
  uVar4 = mqc->a - uVar1;
  mqc->a = uVar4;
  if (mqc->c >> 0x10 < uVar1) {
    OVar3 = 1 - poVar2->mps;
    if (uVar1 > uVar4) {
      OVar3 = poVar2->mps;
    }
    uVar5 = (ulong)(uVar1 <= uVar4);
    mqc->a = uVar1;
  }
  else {
    mqc->c = mqc->c + uVar1 * -0x10000;
    if ((short)uVar4 < 0) {
      return poVar2->mps;
    }
    uVar5 = (ulong)(uVar4 < uVar1);
    OVar3 = 1 - poVar2->mps;
    if (uVar4 >= uVar1) {
      OVar3 = poVar2->mps;
    }
  }
  *mqc->curctx = (&poVar2->nmps)[uVar5];
  opj_mqc_renormd(mqc);
  return OVar3;
}

Assistant:

OPJ_INT32 opj_mqc_decode(opj_mqc_t *const mqc) {
	OPJ_INT32 d;
	mqc->a -= (*mqc->curctx)->qeval;
	if ((mqc->c >> 16) < (*mqc->curctx)->qeval) {
		d = opj_mqc_lpsexchange(mqc);
		opj_mqc_renormd(mqc);
	} else {
		mqc->c -= (*mqc->curctx)->qeval << 16;
		if ((mqc->a & 0x8000) == 0) {
			d = opj_mqc_mpsexchange(mqc);
			opj_mqc_renormd(mqc);
		} else {
			d = (OPJ_INT32)(*mqc->curctx)->mps;
		}
	}

	return d;
}